

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O2

IRC_Bot * __thiscall ServerManager::getServer(ServerManager *this,string_view serverConfig)

{
  pointer puVar1;
  bool bVar2;
  pointer puVar3;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  puVar3 = (this->m_servers).
           super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_servers).
           super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      return (IRC_Bot *)0x0;
    }
    lhs = (basic_string_view<char,_std::char_traits<char>_>)Jupiter::IRC::Client::getConfigSection()
    ;
    bVar2 = jessilib::equalsi<char,char>(lhs,serverConfig);
    if (bVar2) break;
    puVar3 = puVar3 + 1;
  }
  return (puVar3->_M_t).super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
         super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
         super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl;
}

Assistant:

IRC_Bot *ServerManager::getServer(std::string_view serverConfig) {
	for (const auto& server : m_servers) {
		if (jessilib::equalsi(server->getConfigSection(), serverConfig)) {
			return server.get();
		}
	}

	return nullptr;
}